

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O3

void __thiscall duckdb::BlockwiseNLJoinState::~BlockwiseNLJoinState(BlockwiseNLJoinState *this)

{
  ~BlockwiseNLJoinState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit BlockwiseNLJoinState(ExecutionContext &context, ColumnDataCollection &rhs,
	                              const PhysicalBlockwiseNLJoin &op)
	    : op(op), cross_product(rhs), left_outer(IsLeftOuterJoin(op.join_type)), match_sel(STANDARD_VECTOR_SIZE),
	      executor(context.client, *op.condition) {
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
		ResetMatches();
	}